

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseTemplateParam(State *state)

{
  bool bVar1;
  char *pcVar2;
  char *pcStack_48;
  State copy;
  
  pcVar2 = state->mangled_cur;
  if (*pcVar2 == 'T') {
    if (pcVar2[1] == '_') {
      pcVar2 = pcVar2 + 2;
    }
    else {
      pcStack_48 = state->mangled_cur;
      copy.mangled_cur = state->out_cur;
      copy.out_cur = state->out_begin;
      copy.out_begin = state->out_end;
      copy.out_end = state->prev_name;
      copy.prev_name = *(char **)&state->prev_name_length;
      state->mangled_cur = pcVar2 + 1;
      bVar1 = ParseNumber(state,(int *)0x0);
      if ((!bVar1) || (*state->mangled_cur != '_')) goto LAB_001210b5;
      pcVar2 = state->mangled_cur + 1;
    }
    state->mangled_cur = pcVar2;
    MaybeAppend(state,"?");
    bVar1 = true;
  }
  else {
    pcStack_48 = state->mangled_cur;
    copy.mangled_cur = state->out_cur;
    copy.out_cur = state->out_begin;
    copy.out_begin = state->out_end;
    copy.out_end = state->prev_name;
    copy.prev_name = *(char **)&state->prev_name_length;
LAB_001210b5:
    bVar1 = false;
    state->out_begin = copy.out_cur;
    state->out_end = copy.out_begin;
    state->prev_name = copy.out_end;
    *(char **)&state->prev_name_length = copy.prev_name;
    state->mangled_cur = pcStack_48;
    state->out_cur = copy.mangled_cur;
    state->out_begin = copy.out_cur;
    state->out_end = copy.out_begin;
  }
  return bVar1;
}

Assistant:

static bool ParseTemplateParam(State *state) {
  if (ParseTwoCharToken(state, "T_")) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;
  }

  State copy = *state;
  if (ParseOneCharToken(state, 'T') && ParseNumber(state, NULL) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;
  }
  *state = copy;
  return false;
}